

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O2

string * __thiscall
flatbuffers::lobster::LobsterGenerator::GenTypeName_abi_cxx11_
          (string *__return_storage_ptr__,LobsterGenerator *this,Type *type)

{
  uint uVar1;
  BaseType BVar2;
  size_t sVar3;
  char *__lhs;
  string bits;
  allocator<char> local_31;
  string local_30;
  
  sVar3 = SizeOf(type->base_type);
  NumToString<unsigned_long>(&local_30,sVar3 * 8);
  BVar2 = type->base_type;
  uVar1 = BVar2 - BASE_TYPE_UTYPE;
  if (uVar1 < 10) {
    if (uVar1 < 10) {
      __lhs = &DAT_0027694c + *(int *)(&DAT_0027694c + (ulong)uVar1 * 4);
    }
    else {
      __lhs = "int";
    }
  }
  else {
    if (1 < BVar2 - BASE_TYPE_FLOAT) {
      if (BVar2 == BASE_TYPE_STRUCT) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"table",&local_31);
      }
      else if (BVar2 == BASE_TYPE_STRING) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"string",&local_31);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"none",&local_31);
      }
      goto LAB_001f1d0c;
    }
    __lhs = "float";
  }
  std::operator+(__return_storage_ptr__,__lhs,&local_30);
LAB_001f1d0c:
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeName(const Type &type) {
    auto bits = NumToString(SizeOf(type.base_type) * 8);
    if (IsInteger(type.base_type)) {
      if (IsUnsigned(type.base_type))
        return "uint" + bits;
      else
        return "int" + bits;
    }
    if (IsFloat(type.base_type)) return "float" + bits;
    if (IsString(type)) return "string";
    if (type.base_type == BASE_TYPE_STRUCT) return "table";
    return "none";
  }